

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

float __thiscall pbrt::SampledGrid<float>::MaximumValue(SampledGrid<float> *this,Bounds3f *bounds)

{
  float *pfVar1;
  uint *in_RSI;
  long in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar6 [12];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Point3<float> PVar12;
  Tuple3<pbrt::Point3,_int> TVar13;
  int x;
  int y;
  int z;
  float maxValue;
  Point3i pi [2];
  Point3f ps [2];
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  uint uVar14;
  Tuple3<pbrt::Point3,_int> *t2;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe90;
  Tuple3<pbrt::Point3,_float> *t;
  Point3i *p;
  SampledGrid<float> *this_00;
  float local_128;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 local_118;
  int local_110;
  float local_10c;
  Tuple3<pbrt::Point3,_int> local_108;
  undefined1 local_f4 [20];
  int local_e0;
  Point3i local_d4;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a0;
  int local_98;
  Tuple3<pbrt::Point3,_int> local_90;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  Tuple3<pbrt::Point3,_float> local_54;
  undefined8 local_48;
  int local_40;
  undefined8 local_3c;
  int local_34;
  Tuple3<pbrt::Point3,_int> local_28 [2];
  uint *local_10;
  undefined1 auVar7 [56];
  
  auVar2._0_4_ = (float)*(int *)(in_RDI + 0x20);
  auVar2._4_12_ = in_ZMM0._4_12_;
  uVar14 = 0xbf000000;
  auVar3 = SUB6416(ZEXT464(0xbf000000),0);
  auVar2 = vfmadd213ss_fma(auVar2,ZEXT416(*in_RSI),auVar3);
  auVar6 = auVar2._4_12_;
  auVar8._0_4_ = (float)*(int *)(in_RDI + 0x24);
  auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
  vfmadd213ss_fma(auVar8,ZEXT416(in_RSI[1]),auVar3);
  auVar10._0_4_ = (float)*(int *)(in_RDI + 0x28);
  auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
  vfmadd213ss_fma(auVar10,ZEXT416(in_RSI[2]),auVar3);
  t2 = local_28;
  local_10 = in_RSI;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(0xbf000000,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0.0);
  auVar3._0_4_ = (float)*(int *)(in_RDI + 0x20);
  auVar3._4_12_ = auVar6;
  auVar2 = vfmadd213ss_fma(auVar3,ZEXT416(local_10[3]),ZEXT416(uVar14));
  auVar7 = ZEXT856(auVar2._8_8_);
  auVar9._0_4_ = (float)*(int *)(in_RDI + 0x24);
  auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
  vfmadd213ss_fma(auVar9,ZEXT416(local_10[4]),ZEXT416(uVar14));
  auVar11._0_4_ = (float)*(int *)(in_RDI + 0x28);
  auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
  vfmadd213ss_fma(auVar11,ZEXT416(local_10[5]),ZEXT416(uVar14));
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c,
             in_stack_fffffffffffffe78,0.0);
  PVar12 = Floor<pbrt::Point3,float>(in_stack_fffffffffffffe90);
  local_68 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar7;
  local_70 = vmovlpd_avx(auVar4._0_16_);
  t = &local_54;
  local_60 = local_70;
  local_58 = local_68;
  Point3<int>::Point3<float>
            ((Point3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Point3<int>::Point3((Point3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
                      (int)in_stack_fffffffffffffe7c,(int)in_stack_fffffffffffffe78,0);
  TVar13 = (Tuple3<pbrt::Point3,_int>)Max<pbrt::Point3,int>((Tuple3<pbrt::Point3,_int> *)t,t2);
  local_90.z = TVar13.z;
  local_40 = local_90.z;
  local_90._0_8_ = TVar13._0_8_;
  local_48._0_4_ = local_90.x;
  local_48._4_4_ = local_90.y;
  local_90 = TVar13;
  PVar12 = Floor<pbrt::Point3,float>(t);
  local_c0 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  local_c8 = vmovlpd_avx(auVar5._0_16_);
  local_b8 = local_c8;
  local_b0 = local_c0;
  Point3<int>::Point3<float>
            ((Point3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
             (Point3<float> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  p = &local_d4;
  Vector3<int>::Vector3
            ((Vector3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
             (int)in_stack_fffffffffffffe7c,(int)in_stack_fffffffffffffe78,0);
  join_0x00000010_0x00000000_ =
       (Tuple3<pbrt::Point3,_int>)Point3<int>::operator+((Point3<int> *)t,(Vector3<int> *)t2);
  local_98 = local_e0;
  local_a0 = local_f4._12_8_;
  this_00 = (SampledGrid<float> *)local_f4;
  Point3<int>::Point3((Point3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
                      (int)in_stack_fffffffffffffe7c,(int)in_stack_fffffffffffffe78,0);
  TVar13 = (Tuple3<pbrt::Point3,_int>)Min<pbrt::Point3,int>((Tuple3<pbrt::Point3,_int> *)t,t2);
  local_108._0_8_ = TVar13._0_8_;
  local_3c._0_4_ = local_108.x;
  local_3c._4_4_ = local_108.y;
  local_108.z = TVar13.z;
  local_34 = local_108.z;
  local_118 = local_48;
  local_110 = local_40;
  local_108 = TVar13;
  local_10c = Lookup(this_00,p);
  for (local_11c = local_40; local_11c <= local_34; local_11c = local_11c + 1) {
    for (local_120 = local_48._4_4_; local_120 <= local_3c._4_4_; local_120 = local_120 + 1) {
      for (local_124 = (int)local_48; local_124 <= (int)local_3c; local_124 = local_124 + 1) {
        Point3<int>::Point3((Point3<int> *)CONCAT44(uVar14,in_stack_fffffffffffffe80),
                            (int)in_stack_fffffffffffffe7c,(int)in_stack_fffffffffffffe78,0);
        local_128 = Lookup(this_00,p);
        pfVar1 = std::max<float>(&local_10c,&local_128);
        local_10c = *pfVar1;
      }
    }
  }
  return local_10c;
}

Assistant:

T MaximumValue(const Bounds3f &bounds) const {
        Point3f ps[2] = {Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                                 bounds.pMin.z * nz - .5f),
                         Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                                 bounds.pMax.z * nz - .5f)};
        Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                         Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                             Point3i(nx - 1, ny - 1, nz - 1))};

        T maxValue = Lookup(Point3i(pi[0]));
        for (int z = pi[0].z; z <= pi[1].z; ++z)
            for (int y = pi[0].y; y <= pi[1].y; ++y)
                for (int x = pi[0].x; x <= pi[1].x; ++x) {
                    using std::max;
                    maxValue = max(maxValue, Lookup(Point3i(x, y, z)));
                }

        return maxValue;
    }